

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<Assimp::FIShortValue> __thiscall
Assimp::FIShortValue::create(FIShortValue *this,vector<short,_std::allocator<short>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Assimp::FIShortValue> sVar1;
  vector<short,_std::allocator<short>_> local_28;
  vector<short,_std::allocator<short>_> *value_local;
  
  local_28.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)value;
  value_local = (vector<short,_std::allocator<short>_> *)this;
  std::make_shared<Assimp::FIShortValueImpl,std::vector<short,std::allocator<short>>>(&local_28);
  std::shared_ptr<Assimp::FIShortValue>::shared_ptr<Assimp::FIShortValueImpl,void>
            ((shared_ptr<Assimp::FIShortValue> *)this,
             (shared_ptr<Assimp::FIShortValueImpl> *)&local_28);
  std::shared_ptr<Assimp::FIShortValueImpl>::~shared_ptr
            ((shared_ptr<Assimp::FIShortValueImpl> *)&local_28);
  sVar1.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIShortValue>)
         sVar1.super___shared_ptr<Assimp::FIShortValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIShortValue> FIShortValue::create(std::vector<int16_t> &&value) {
    return std::make_shared<FIShortValueImpl>(std::move(value));
}